

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O1

int pztopology::TPZTetrahedron::NumSides(int dimension)

{
  int iVar1;
  
  if (3 < (uint)dimension) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZTetrahedron::NumSides. Bad parameter i.\n",0x2b);
    return 0;
  }
  iVar1 = 1;
  if (dimension != 3) {
    iVar1 = *(int *)(&DAT_015422c4 + (ulong)(uint)dimension * 4);
  }
  return iVar1;
}

Assistant:

int TPZTetrahedron::NumSides(int dimension) {		if(dimension<0 || dimension> 3) {
		PZError << "TPZTetrahedron::NumSides. Bad parameter i.\n";
		return 0;
	}
		if(dimension==0) return 4;
		if(dimension==1) return 6;
		if(dimension==2) return 4;
		if(dimension==3) return 1;
		return -1;
	}